

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O2

block * gen_mtp2type_abbrev(compiler_state_t *cstate,int type)

{
  uint uVar1;
  block *b0;
  block *pbVar2;
  bpf_u_int32 bVar3;
  bpf_u_int32 bVar4;
  char *fmt;
  bpf_u_int32 mask;
  bpf_u_int32 bVar5;
  bpf_int32 v;
  
  switch(type) {
  case 0x16:
    uVar1 = cstate->linktype - 0x8b;
    if ((0x3a < uVar1) || ((0x400000000000003U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) {
      fmt = "\'fisu\' supported only on MTP2";
      break;
    }
    bVar3 = cstate->off_li;
    v = 0;
    mask = 0x3f;
    bVar5 = 0x10;
    bVar4 = bVar5;
    goto LAB_0010fc7c;
  case 0x17:
    uVar1 = cstate->linktype - 0x8b;
    if ((uVar1 < 0x3b) && ((0x400000000000003U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
      bVar4 = 0x10;
      bVar5 = 0x3f;
      pbVar2 = gen_ncmp(cstate,OR_PACKET,cstate->off_li,0x10,0x3f,0x20,1,2);
      bVar3 = cstate->off_li;
LAB_0010fc23:
      b0 = gen_ncmp(cstate,OR_PACKET,bVar3,bVar4,bVar5,0x20,0,0);
      gen_and(b0,pbVar2);
      return pbVar2;
    }
    fmt = "\'lssu\' supported only on MTP2";
    break;
  case 0x18:
    uVar1 = cstate->linktype - 0x8b;
    if ((uVar1 < 0x3b) && ((0x400000000000003U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
      bVar3 = cstate->off_li;
      v = 2;
      bVar5 = 0x10;
      mask = 0x3f;
      bVar4 = 0x20;
      goto LAB_0010fc7c;
    }
    fmt = "\'msu\' supported only on MTP2";
    break;
  case 0x19:
    uVar1 = cstate->linktype - 0x8b;
    if ((0x3a < uVar1) || ((0x400000000000003U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) {
      fmt = "\'hfisu\' supported only on MTP2_HSL";
      break;
    }
    bVar3 = cstate->off_li_hsl;
    v = 0;
    bVar4 = 0x10;
    goto LAB_0010fc6f;
  case 0x1a:
    uVar1 = cstate->linktype - 0x8b;
    if ((uVar1 < 0x3b) && ((0x400000000000003U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
      bVar4 = 8;
      pbVar2 = gen_ncmp(cstate,OR_PACKET,cstate->off_li_hsl,8,0xff80,0x20,1,0x100);
      bVar3 = cstate->off_li_hsl;
      bVar5 = 0xff80;
      goto LAB_0010fc23;
    }
    fmt = "\'hlssu\' supported only on MTP2_HSL";
    break;
  case 0x1b:
    uVar1 = cstate->linktype - 0x8b;
    if ((0x3a < uVar1) || ((0x400000000000003U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) {
      fmt = "\'hmsu\' supported only on MTP2_HSL";
      break;
    }
    bVar3 = cstate->off_li_hsl;
    v = 0x100;
    bVar4 = 0x20;
LAB_0010fc6f:
    bVar5 = 8;
    mask = 0xff80;
LAB_0010fc7c:
    pbVar2 = gen_ncmp(cstate,OR_PACKET,bVar3,bVar5,mask,bVar4,0,v);
    return pbVar2;
  default:
    abort();
  }
  bpf_error(cstate,fmt);
}

Assistant:

struct block *
gen_mtp2type_abbrev(compiler_state_t *cstate, int type)
{
	struct block *b0, *b1;

	switch (type) {

	case M_FISU:
		if ( (cstate->linktype != DLT_MTP2) &&
		     (cstate->linktype != DLT_ERF) &&
		     (cstate->linktype != DLT_MTP2_WITH_PHDR) )
			bpf_error(cstate, "'fisu' supported only on MTP2");
		/* gen_ncmp(cstate, offrel, offset, size, mask, jtype, reverse, value) */
		b0 = gen_ncmp(cstate, OR_PACKET, cstate->off_li, BPF_B, 0x3f, BPF_JEQ, 0, 0);
		break;

	case M_LSSU:
		if ( (cstate->linktype != DLT_MTP2) &&
		     (cstate->linktype != DLT_ERF) &&
		     (cstate->linktype != DLT_MTP2_WITH_PHDR) )
			bpf_error(cstate, "'lssu' supported only on MTP2");
		b0 = gen_ncmp(cstate, OR_PACKET, cstate->off_li, BPF_B, 0x3f, BPF_JGT, 1, 2);
		b1 = gen_ncmp(cstate, OR_PACKET, cstate->off_li, BPF_B, 0x3f, BPF_JGT, 0, 0);
		gen_and(b1, b0);
		break;

	case M_MSU:
		if ( (cstate->linktype != DLT_MTP2) &&
		     (cstate->linktype != DLT_ERF) &&
		     (cstate->linktype != DLT_MTP2_WITH_PHDR) )
			bpf_error(cstate, "'msu' supported only on MTP2");
		b0 = gen_ncmp(cstate, OR_PACKET, cstate->off_li, BPF_B, 0x3f, BPF_JGT, 0, 2);
		break;

	case MH_FISU:
		if ( (cstate->linktype != DLT_MTP2) &&
		     (cstate->linktype != DLT_ERF) &&
		     (cstate->linktype != DLT_MTP2_WITH_PHDR) )
			bpf_error(cstate, "'hfisu' supported only on MTP2_HSL");
		/* gen_ncmp(cstate, offrel, offset, size, mask, jtype, reverse, value) */
		b0 = gen_ncmp(cstate, OR_PACKET, cstate->off_li_hsl, BPF_H, 0xff80, BPF_JEQ, 0, 0);
		break;

	case MH_LSSU:
		if ( (cstate->linktype != DLT_MTP2) &&
		     (cstate->linktype != DLT_ERF) &&
		     (cstate->linktype != DLT_MTP2_WITH_PHDR) )
			bpf_error(cstate, "'hlssu' supported only on MTP2_HSL");
		b0 = gen_ncmp(cstate, OR_PACKET, cstate->off_li_hsl, BPF_H, 0xff80, BPF_JGT, 1, 0x0100);
		b1 = gen_ncmp(cstate, OR_PACKET, cstate->off_li_hsl, BPF_H, 0xff80, BPF_JGT, 0, 0);
		gen_and(b1, b0);
		break;

	case MH_MSU:
		if ( (cstate->linktype != DLT_MTP2) &&
		     (cstate->linktype != DLT_ERF) &&
		     (cstate->linktype != DLT_MTP2_WITH_PHDR) )
			bpf_error(cstate, "'hmsu' supported only on MTP2_HSL");
		b0 = gen_ncmp(cstate, OR_PACKET, cstate->off_li_hsl, BPF_H, 0xff80, BPF_JGT, 0, 0x0100);
		break;

	default:
		abort();
	}
	return b0;
}